

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

size_t __thiscall Graph::reachableInPath(Graph *this,pathType *path,size_t startIndex,int speed)

{
  ulong uVar1;
  size_type sVar2;
  const_reference ppEVar3;
  int *piVar4;
  int in_ECX;
  ulong in_RDX;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *in_RSI;
  bool bVar5;
  int local_1c;
  ulong local_18;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while( true ) {
    uVar1 = local_18;
    bVar5 = false;
    if (0 < local_1c) {
      sVar2 = std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::size(local_10);
      bVar5 = uVar1 < sVar2 - 1;
    }
    if (!bVar5) break;
    ppEVar3 = std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::operator[]
                        (local_10,local_18);
    piVar4 = std::min<int>(&local_1c,&(*ppEVar3)->maxSpeed);
    uVar1 = local_18;
    local_1c = *piVar4;
    local_18 = local_18 + 1;
    ppEVar3 = std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::operator[](local_10,uVar1);
    local_1c = local_1c - (*ppEVar3)->length;
  }
  return local_18;
}

Assistant:

size_t Graph::reachableInPath(const pathType& path, size_t startIndex, int speed) {
  while(speed > 0 && startIndex < path.size()-1) {
    speed = std::min(speed, path[startIndex]->maxSpeed);
    speed -= path[startIndex++]->length;
  }
  return startIndex;
}